

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<short,_sptk::int24_t>::Run
          (DataTransform<short,_sptk::int24_t> *this,istream *input_stream)

{
  NumericType NVar1;
  WarningType WVar2;
  short sVar3;
  int24_t *piVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  size_t *__idx;
  uint8_t *puVar8;
  uint8_t uVar9;
  uint uVar10;
  uint8_t *puVar11;
  uint8_t uVar12;
  ulong uVar13;
  uint uVar14;
  int24_t *piVar15;
  bool bVar16;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar17;
  short input_data;
  int24_t local_2a4;
  int24_t local_2a1;
  ushort local_29e;
  short local_29c;
  allocator local_299;
  int24_t *local_298;
  int24_t *local_290;
  uint8_t *local_288;
  uint8_t *local_280;
  uint8_t *local_278;
  uint8_t *local_270;
  ulong local_268;
  istream *local_260;
  string *local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_290 = &this->minimum_value_;
  local_298 = &this->maximum_value_;
  local_280 = (this->maximum_value_).value + 1;
  local_288 = (this->maximum_value_).value + 2;
  local_270 = (this->minimum_value_).value + 1;
  local_278 = (this->minimum_value_).value + 2;
  local_258 = &this->print_format_;
  uVar13 = 0;
  local_260 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar16 = word._M_string_length == 0;
      if (!bVar16) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_29e = in_FPUControlWord | 0xc00;
        input_data = (short)ROUND(in_ST0);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_29c = input_data;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar16) goto LAB_00114a55;
      if (bVar16) {
        if (bVar16) {
LAB_00114ce2:
          bVar16 = true;
          if ((this->is_ascii_output_ == true) && ((int)uVar13 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_00114d04:
          bVar16 = false;
        }
        return bVar16;
      }
    }
    else {
      bVar16 = sptk::ReadStream<short>(&input_data,input_stream);
      if (!bVar16) goto LAB_00114ce2;
LAB_00114a55:
      sVar3 = input_data;
      local_268 = uVar13;
      iVar5 = sptk::int24_t::operator_cast_to_int(local_290);
      iVar6 = sptk::int24_t::operator_cast_to_int(local_298);
      piVar15 = local_290;
      if (iVar6 <= iVar5) goto LAB_00114bae;
      NVar1 = this->input_numeric_type_;
      if (NVar1 == kFloatingPoint) {
LAB_00114a93:
        iVar6 = (int)input_data;
        iVar5 = sptk::int24_t::operator_cast_to_int(local_290);
        piVar4 = local_298;
        puVar8 = local_270;
        puVar11 = local_278;
        if ((iVar5 <= iVar6) &&
           (iVar5 = sptk::int24_t::operator_cast_to_int(local_298), puVar8 = local_280,
           puVar11 = local_288, piVar15 = piVar4, input_data <= iVar5)) goto LAB_00114bae;
LAB_00114b25:
        uVar9 = *puVar11;
        uVar12 = *puVar8;
        uVar14 = (uint)piVar15->value[0];
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&word,(int)local_268);
          std::operator<<(poVar7,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_299);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar2 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          input_stream = local_260;
          if (WVar2 == kExit) goto LAB_00114d04;
        }
      }
      else {
        if (NVar1 == kUnsignedInteger) {
          uVar10 = (uint)input_data;
          uVar14 = sptk::int24_t::operator_cast_to_int(local_290);
          piVar4 = local_298;
          puVar8 = local_270;
          puVar11 = local_278;
          if ((uVar10 < uVar14) ||
             (uVar14 = sptk::int24_t::operator_cast_to_int(local_298), puVar8 = local_280,
             puVar11 = local_288, piVar15 = piVar4, uVar14 < (uint)(int)input_data))
          goto LAB_00114b25;
        }
        else if (NVar1 == kSignedInteger) goto LAB_00114a93;
LAB_00114bae:
        if (this->rounding_ == true) {
          if (input_data < 1) {
            dVar17 = (double)(int)input_data + -0.5;
          }
          else {
            dVar17 = (double)(int)input_data + 0.5;
          }
          uVar14 = (uint)dVar17;
          uVar12 = (uint8_t)(uVar14 >> 8);
          uVar9 = (uint8_t)(uVar14 >> 0x10);
        }
        else {
          uVar14 = (uint)sVar3;
          uVar12 = (uint8_t)((ushort)sVar3 >> 8);
          uVar9 = (uint8_t)(uVar14 >> 0xf);
        }
      }
      if (this->is_ascii_output_ == true) {
        local_2a1.value[0] = (uint8_t)uVar14;
        local_2a1.value[1] = uVar12;
        local_2a1.value[2] = uVar9;
        bVar16 = sptk::SnPrintf<sptk::int24_t>(&local_2a1,local_258,0x80,buffer);
        if (!bVar16) goto LAB_00114d04;
        std::operator<<((ostream *)&std::cout,buffer);
        if (((int)local_268 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          uVar13 = local_268;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          uVar13 = local_268;
        }
      }
      else {
        local_2a4.value[0] = (uint8_t)uVar14;
        local_2a4.value[1] = uVar12;
        local_2a4.value[2] = uVar9;
        bVar16 = sptk::WriteStream<sptk::int24_t>(&local_2a4,(ostream *)&std::cout);
        uVar13 = local_268;
        if (!bVar16) goto LAB_00114d04;
      }
    }
    uVar13 = (ulong)((int)uVar13 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }